

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O1

void __thiscall SudokuGitter::print(SudokuGitter *this)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->elements != 0) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      if (this->elements != 0) {
        uVar2 = 0;
        do {
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->elements);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->elements);
  }
  return;
}

Assistant:

void SudokuGitter::print() {
    for (unsigned int irow = 0; irow < getElements(); ++irow) {
        std::cout << " ";
        for (unsigned int icol = 0; icol < getElements(); ++icol) {
            std::cout << getCellValue(irow, icol) << " ";
        }
        std::cout << std::endl; // << "--" << std::endl;
    }
}